

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

QString * __thiscall
VcprojGenerator::replaceExtraCompilerVariables
          (VcprojGenerator *this,QString *var,QStringList *in,QStringList *out,ReplaceFor forShell)

{
  QChar sep;
  bool bVar1;
  MakefileGenerator *this_00;
  ProString *this_01;
  long *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  ProStringList *incpath;
  ProStringList *defines;
  QString *ret;
  rvalue_ref in_stack_fffffffffffffc58;
  QMakeProject *in_stack_fffffffffffffc60;
  ProString *this_02;
  undefined6 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6e;
  undefined1 in_stack_fffffffffffffc6f;
  ProString *in_stack_fffffffffffffc70;
  QLatin1String *this_03;
  QString *in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  byte bVar2;
  QString *ch;
  QChar local_2fa [13];
  QString *local_2e0;
  CaseSensitivity local_2d8;
  undefined1 local_2d0 [48];
  undefined1 local_2a0 [12];
  ReplaceFor in_stack_fffffffffffffd6c;
  QStringList *in_stack_fffffffffffffd70;
  QStringList *in_stack_fffffffffffffd78;
  QString *in_stack_fffffffffffffd80;
  MakefileGenerator *in_stack_fffffffffffffd88;
  undefined1 local_258 [48];
  undefined1 local_228 [96];
  QString *local_1c8;
  CaseSensitivity local_1c0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  ch = in_RDI;
  MakefileGenerator::replaceExtraCompilerVariables
            (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
             in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58);
  this_00 = (MakefileGenerator *)
            QMakeProject::values(in_stack_fffffffffffffc60,(ProKey *)in_stack_fffffffffffffc58);
  ProKey::~ProKey((ProKey *)0x29a4a2);
  bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x29a4b6);
  if (bVar1) {
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58);
    QString::QString((QString *)
                     CONCAT17(in_stack_fffffffffffffc6f,
                              CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)),
                     (char *)ch);
    QString::QString((QString *)
                     CONCAT17(in_stack_fffffffffffffc6f,
                              CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)),
                     (char *)ch);
    QString::QString((QString *)
                     CONCAT17(in_stack_fffffffffffffc6f,
                              CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)),
                     (char *)ch);
    MakefileGenerator::varGlue
              (this_00,(ProKey *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc78,&in_stack_fffffffffffffc70->m_string,
               (QString *)
               CONCAT17(in_stack_fffffffffffffc6f,
                        CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)));
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58);
    QString::QString((QString *)
                     CONCAT17(in_stack_fffffffffffffc6f,
                              CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)),
                     (char *)ch);
    QString::QString((QString *)
                     CONCAT17(in_stack_fffffffffffffc6f,
                              CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)),
                     (char *)ch);
    QString::QString((QString *)
                     CONCAT17(in_stack_fffffffffffffc6f,
                              CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)),
                     (char *)ch);
    MakefileGenerator::varGlue
              (this_00,(ProKey *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc78,&in_stack_fffffffffffffc70->m_string,
               (QString *)
               CONCAT17(in_stack_fffffffffffffc6f,
                        CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)));
    ::operator+((QString *)
                CONCAT17(in_stack_fffffffffffffc6f,
                         CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)),
                (QString *)in_stack_fffffffffffffc60);
    ProString::ProString<QString,QString>
              (in_stack_fffffffffffffc70,
               (QStringBuilder<QString,_QString> *)
               CONCAT17(in_stack_fffffffffffffc6f,
                        CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)));
    QList<ProString>::append
              ((QList<ProString> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    ProString::~ProString((ProString *)0x29a61e);
    QStringBuilder<QString,_QString>::~QStringBuilder
              ((QStringBuilder<QString,_QString> *)in_stack_fffffffffffffc60);
    QString::~QString((QString *)0x29a638);
    QString::~QString((QString *)0x29a645);
    QString::~QString((QString *)0x29a652);
    QString::~QString((QString *)0x29a65f);
    ProKey::~ProKey((ProKey *)0x29a66c);
    QString::~QString((QString *)0x29a679);
    QString::~QString((QString *)0x29a686);
    QString::~QString((QString *)0x29a693);
    QString::~QString((QString *)0x29a6a0);
    ProKey::~ProKey((ProKey *)0x29a6ad);
  }
  QLatin1String::QLatin1String
            ((QLatin1String *)in_stack_fffffffffffffc70,
             (char *)CONCAT17(in_stack_fffffffffffffc6f,
                              CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)));
  QList<ProString>::first((QList<ProString> *)in_stack_fffffffffffffc60);
  ProString::toQString(in_stack_fffffffffffffc58);
  QString::replace((QLatin1String *)in_RDI,local_1c8,local_1c0);
  QString::~QString((QString *)0x29a710);
  this_03 = (QLatin1String *)in_RSI[0x1b];
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58);
  this_01 = (ProString *)
            QMakeProject::values(in_stack_fffffffffffffc60,(ProKey *)in_stack_fffffffffffffc58);
  ProKey::~ProKey((ProKey *)0x29a768);
  bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x29a77c);
  bVar2 = 0;
  if (bVar1) {
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58);
    (**(code **)(*in_RSI + 0xb0))(local_228,in_RSI,local_258);
    bVar1 = QString::isEmpty((QString *)0x29a7de);
    bVar2 = bVar1 ^ 0xff;
    QString::~QString((QString *)0x29a802);
    ProKey::~ProKey((ProKey *)0x29a818);
  }
  if ((bVar2 & 1) != 0) {
    this_02 = this_01;
    ProKey::ProKey((ProKey *)this_01,(char *)in_stack_fffffffffffffc58);
    (**(code **)(*in_RSI + 0xb0))(local_2a0,in_RSI,local_2d0);
    ProString::ProString(this_02,&in_stack_fffffffffffffc58->m_string);
    QList<ProString>::append((QList<ProString> *)this_02,in_stack_fffffffffffffc58);
    ProString::~ProString((ProString *)0x29a895);
    QString::~QString((QString *)0x29a8a2);
    ProKey::~ProKey((ProKey *)0x29a8af);
  }
  QLatin1String::QLatin1String
            (this_03,(char *)CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffc6e,
                                                     in_stack_fffffffffffffc68)));
  QChar::QChar<char,_true>(local_2fa,' ');
  sep.ucs._1_1_ = bVar2;
  sep.ucs._0_1_ = in_stack_fffffffffffffc6e;
  ProStringList::join((ProStringList *)this_01,sep);
  QString::replace((QLatin1String *)in_RDI,local_2e0,local_2d8);
  QString::~QString((QString *)0x29a92c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return ch;
  }
  __stack_chk_fail();
}

Assistant:

QString VcprojGenerator::replaceExtraCompilerVariables(
        const QString &var, const QStringList &in, const QStringList &out, ReplaceFor forShell)
{
    QString ret = MakefileGenerator::replaceExtraCompilerVariables(var, in, out, forShell);

    ProStringList &defines = project->values("VCPROJ_MAKEFILE_DEFINES");
    if(defines.isEmpty())
        defines.append(varGlue("PRL_EXPORT_DEFINES"," -D"," -D","") +
                       varGlue("DEFINES"," -D"," -D",""));
    ret.replace(QLatin1String("$(DEFINES)"), defines.first().toQString());

    ProStringList &incpath = project->values("VCPROJ_MAKEFILE_INCPATH");
    if(incpath.isEmpty() && !this->var("MSVCPROJ_INCPATH").isEmpty())
        incpath.append(this->var("MSVCPROJ_INCPATH"));
    ret.replace(QLatin1String("$(INCPATH)"), incpath.join(' '));

    return ret;
}